

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

char * ulocimp_toLegacyKey_63(char *key)

{
  int iVar1;
  undefined8 *puVar2;
  LocExtKeyData *keyData;
  char *key_local;
  
  iVar1 = init((EVP_PKEY_CTX *)key);
  if ((char)iVar1 == '\0') {
    key_local = (char *)0x0;
  }
  else {
    puVar2 = (undefined8 *)uhash_get_63(gLocExtKeyMap,key);
    if (puVar2 == (undefined8 *)0x0) {
      key_local = (char *)0x0;
    }
    else {
      key_local = (char *)*puVar2;
    }
  }
  return key_local;
}

Assistant:

U_CFUNC const char*
ulocimp_toLegacyKey(const char* key) {
    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        return keyData->legacyId;
    }
    return NULL;
}